

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O0

idx_t __thiscall
duckdb::RowMatcher::Match
          (RowMatcher *this,DataChunk *lhs,vector<duckdb::TupleDataVectorFormat,_true> *lhs_formats,
          SelectionVector *sel,idx_t count,TupleDataLayout *rhs_layout,Vector *rhs_row_locations,
          SelectionVector *no_match_sel,idx_t *no_match_count)

{
  match_function_t p_Var1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  SelectionVector *in_RCX;
  vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_> *in_RDI;
  idx_t in_R8;
  TupleDataLayout *in_R9;
  Vector *in_stack_00000008;
  SelectionVector *in_stack_00000010;
  idx_t *in_stack_00000018;
  value_type *match_function;
  idx_t col_idx;
  ulong in_stack_ffffffffffffff68;
  vector<duckdb::MatchFunction,_true> *in_stack_ffffffffffffff70;
  ulong local_48;
  idx_t local_38;
  
  local_48 = 0;
  local_38 = in_R8;
  while( true ) {
    sVar2 = ::std::vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>::size
                      (in_RDI);
    if (sVar2 <= local_48) break;
    pvVar3 = vector<duckdb::MatchFunction,_true>::operator[]
                       (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    p_Var1 = pvVar3->function;
    pvVar4 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff70,
                        in_stack_ffffffffffffff68);
    pvVar5 = vector<duckdb::TupleDataVectorFormat,_true>::operator[]
                       ((vector<duckdb::TupleDataVectorFormat,_true> *)in_stack_ffffffffffffff70,
                        in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff70 = &pvVar3->child_functions;
    in_stack_ffffffffffffff68 = local_48;
    local_38 = (*p_Var1)(pvVar4,pvVar5,in_RCX,local_38,in_R9,in_stack_00000008,local_48,
                         in_stack_ffffffffffffff70,in_stack_00000010,in_stack_00000018);
    local_48 = local_48 + 1;
  }
  return local_38;
}

Assistant:

idx_t RowMatcher::Match(DataChunk &lhs, const vector<TupleDataVectorFormat> &lhs_formats, SelectionVector &sel,
                        idx_t count, const TupleDataLayout &rhs_layout, Vector &rhs_row_locations,
                        SelectionVector *no_match_sel, idx_t &no_match_count) {
	D_ASSERT(!match_functions.empty());
	for (idx_t col_idx = 0; col_idx < match_functions.size(); col_idx++) {
		const auto &match_function = match_functions[col_idx];
		count =
		    match_function.function(lhs.data[col_idx], lhs_formats[col_idx], sel, count, rhs_layout, rhs_row_locations,
		                            col_idx, match_function.child_functions, no_match_sel, no_match_count);
	}
	return count;
}